

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O3

bool __thiscall embree::TokenStream::trySymbol(TokenStream *this,string *symbol)

{
  char cVar1;
  Stream<int> *this_00;
  int *piVar2;
  size_t n;
  
  if (symbol->_M_string_length != 0) {
    n = 0;
    do {
      cVar1 = (symbol->_M_dataplus)._M_p[n];
      piVar2 = Stream<int>::peek((this->cin).ptr);
      this_00 = (this->cin).ptr;
      if (*piVar2 != (int)cVar1) {
        Stream<int>::unget(this_00,n);
        return false;
      }
      Stream<int>::drop(this_00);
      n = n + 1;
    } while (n < symbol->_M_string_length);
  }
  return true;
}

Assistant:

bool TokenStream::trySymbol(const std::string& symbol)
  {
    size_t pos = 0;
    while (pos < symbol.size()) {
      if (symbol[pos] != cin->peek()) { cin->unget(pos); return false; }
      cin->drop(); pos++;
    }
    return true;
  }